

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O1

void __thiscall
QPixmapColorizeFilter::draw
          (QPixmapColorizeFilter *this,QPainter *painter,QPointF *dest,QPixmap *src,QRectF *srcRect)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  QRect QVar4;
  char cVar5;
  byte bVar6;
  Format FVar7;
  int iVar8;
  int iVar9;
  undefined1 *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  QPainter destPainter;
  QPainter bufPainter;
  QPainter maskPainter;
  ulong local_138;
  int local_130;
  QRect local_e0;
  QPointF local_c8;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QPixmapFilter).field_0x8;
  cVar5 = QPixmap::isNull();
  QVar4.x2.m_i = local_b8._8_4_;
  QVar4.y2.m_i = local_b8._12_4_;
  QVar4.x1.m_i = local_b8._0_4_;
  QVar4.y1.m_i = local_b8._4_4_;
  if (cVar5 != '\0') goto LAB_0039de69;
  if ((*(byte *)(lVar2 + 0x98) & 1) == 0) {
    local_58 = (undefined1  [8])dest->xp;
    uStack_50 = (undefined1 *)dest->yp;
    local_48 = (undefined1 *)0xbff0000000000000;
    uStack_40 = 0xbff0000000000000;
    QPainter::drawPixmap((QRectF *)painter,(QPixmap *)local_58,(QRectF *)src);
    QVar4.x2.m_i = local_b8._8_4_;
    QVar4.y2.m_i = local_b8._12_4_;
    QVar4.x1.m_i = local_b8._0_4_;
    QVar4.y1.m_i = local_b8._4_4_;
    goto LAB_0039de69;
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_78);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_98);
  if ((((srcRect->w != 0.0) || (NAN(srcRect->w))) || (srcRect->h != 0.0)) || (NAN(srcRect->h))) {
    local_c8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    _local_58 = (QRect)QRectF::toAlignedRect();
    local_b8 = QPixmap::rect();
    local_c8 = (QPointF)QRect::operator&((QRect *)local_58,(QRect *)local_b8);
    QPixmap::copy(&local_e0);
    QPixmap::toImage();
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    local_48 = local_68;
    local_68 = local_a8;
    local_58 = (undefined1  [8])QFileSystemModel::setResolveSymlinks;
    local_a8 = (undefined1 *)0x0;
    QImage::~QImage((QImage *)local_58);
    QImage::~QImage((QImage *)local_b8);
    QPixmap::~QPixmap((QPixmap *)&local_e0);
    bVar6 = QImage::hasAlphaChannel();
    QImage::convertToFormat
              ((QImage *)local_b8,(Format)&local_78,(ImageConversionFlags)((uint)bVar6 * 2 + 4));
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    local_48 = local_68;
    local_68 = local_a8;
    local_58 = (undefined1  [8])QFileSystemModel::setResolveSymlinks;
    local_a8 = (undefined1 *)0x0;
    QImage::~QImage((QImage *)local_58);
    QImage::~QImage((QImage *)local_b8);
    local_e0.x1.m_i = (local_c8.yp._0_4_ - local_c8.xp._0_4_) + 1;
    local_e0.y1.m_i = (local_c8.yp._4_4_ - local_c8.xp._4_4_) + 1;
    FVar7 = QImage::format();
    QImage::QImage((QImage *)local_b8,(QSize *)&local_e0,FVar7);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    puVar10 = local_a8;
  }
  else {
    QPixmap::toImage();
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    local_48 = local_68;
    local_68 = local_a8;
    local_58 = (undefined1  [8])QFileSystemModel::setResolveSymlinks;
    local_a8 = (undefined1 *)0x0;
    QImage::~QImage((QImage *)local_58);
    QImage::~QImage((QImage *)local_b8);
    bVar6 = QImage::hasAlphaChannel();
    QImage::convertToFormat
              ((QImage *)local_b8,(Format)&local_78,(ImageConversionFlags)((uint)bVar6 * 2 + 4));
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    local_48 = local_68;
    local_68 = local_a8;
    local_58 = (undefined1  [8])QFileSystemModel::setResolveSymlinks;
    local_a8 = (undefined1 *)0x0;
    QImage::~QImage((QImage *)local_58);
    QImage::~QImage((QImage *)local_b8);
    local_e0._0_8_ = QImage::size();
    FVar7 = QImage::format();
    QImage::QImage((QImage *)local_b8,(QSize *)&local_e0,FVar7);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    puVar10 = local_a8;
  }
  local_58 = (undefined1  [8])QFileSystemModel::setResolveSymlinks;
  local_a8 = (undefined1 *)0x0;
  local_48 = local_88;
  local_88 = puVar10;
  QImage::~QImage((QImage *)local_58);
  QImage::~QImage((QImage *)local_b8);
  dVar3 = (double)QPixmap::devicePixelRatio();
  QImage::setDevicePixelRatio(dVar3);
  local_e0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_e0,(QPaintDevice *)&local_98);
  auVar19 = QImage::rect();
  if (auVar19._12_4_ == auVar19._4_4_ + -1 && auVar19._8_4_ == auVar19._0_4_ + -1) {
    auVar19 = QImage::rect();
    QImage::rect();
  }
  local_138 = auVar19._8_8_;
  uVar15 = local_138;
  uVar18 = auVar19._0_8_ >> 0x20;
  lVar11 = QImage::bits();
  lVar12 = QImage::bits();
  lVar13 = QImage::size();
  lVar14 = QImage::size();
  local_130 = auVar19._0_4_;
  local_138._0_4_ = auVar19._8_4_;
  if (lVar13 == lVar14) {
    auVar20 = QImage::rect();
    if (((local_130 != auVar20._0_4_) || (auVar20._8_4_ != (int)local_138)) ||
       ((auVar19._4_4_ != auVar20._4_4_ || ((auVar20._8_8_ ^ uVar15) >> 0x20 != 0))))
    goto LAB_0039db71;
    iVar8 = QImage::width();
    iVar9 = QImage::height();
    if (0 < iVar9 * iVar8) {
      uVar15 = 0;
      do {
        uVar1 = *(uint *)(lVar11 + uVar15 * 4);
        uVar17 = (uVar1 & 0xff) * 5 + (uVar1 >> 4 & 0xff0) + (uVar1 >> 0x10 & 0xff) * 0xb;
        uVar16 = uVar17 >> 5;
        *(uint *)(lVar12 + uVar15 * 4) =
             uVar16 & 0xff | uVar1 & 0xff000000 | (uVar17 & 0x1fe0) << 0xb | (uVar16 & 0xff) << 8;
        uVar15 = uVar15 + 1;
      } while ((uint)(iVar9 * iVar8) != uVar15);
    }
  }
  else {
LAB_0039db71:
    if (auVar19._4_4_ <= auVar19._12_4_) {
      do {
        iVar8 = QImage::height();
        iVar9 = (int)uVar18;
        if (iVar8 <= iVar9) break;
        lVar11 = QImage::scanLine((int)&local_78);
        lVar12 = QImage::scanLine((int)&local_98);
        if (local_130 <= (int)local_138) {
          lVar13 = 0;
          do {
            iVar8 = QImage::width();
            if ((long)iVar8 <= local_130 + lVar13) break;
            uVar1 = *(uint *)(lVar11 + (long)local_130 * 4 + lVar13 * 4);
            uVar17 = (uVar1 & 0xff) * 5 + (uVar1 >> 4 & 0xff0) + (uVar1 >> 0x10 & 0xff) * 0xb;
            uVar16 = uVar17 >> 5;
            *(uint *)(lVar12 + lVar13 * 4) =
                 uVar16 & 0xff | uVar1 & 0xff000000 | (uVar17 & 0x1fe0) << 0xb |
                 (uVar16 & 0xff) << 8;
            lVar13 = lVar13 + 1;
          } while (((int)local_138 - local_130) + 1 != (int)lVar13);
        }
        uVar18 = (ulong)(iVar9 + 1);
      } while (iVar9 != auVar19._12_4_);
    }
  }
  QPainter::setCompositionMode((CompositionMode)&local_e0);
  _local_58 = (QRect)QImage::rect();
  QPainter::fillRect(&local_e0,(QColor *)local_58);
  QPainter::end();
  if ((*(byte *)(lVar2 + 0x98) & 2) != 0) {
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)local_b8,(QImage *)&local_78);
    local_c8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_c8,(QPaintDevice *)local_b8);
    QPainter::setOpacity(*(double *)(lVar2 + 0x90));
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    uStack_50._0_4_ = 0;
    uStack_50._4_4_ = 0;
    QPainter::drawImage(&local_c8,(QImage *)local_58);
    QPainter::end();
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    local_48 = local_88;
    local_88 = local_a8;
    local_58 = (undefined1  [8])QFileSystemModel::setResolveSymlinks;
    local_a8 = (undefined1 *)0x0;
    QImage::~QImage((QImage *)local_58);
    QPainter::~QPainter((QPainter *)&local_c8);
    QImage::~QImage((QImage *)local_b8);
  }
  cVar5 = QImage::hasAlphaChannel();
  if (cVar5 != '\0') {
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)local_b8,(QPaintDevice *)&local_98);
    QPainter::setCompositionMode((CompositionMode)(QPointF *)local_b8);
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    uStack_50._0_4_ = 0;
    uStack_50._4_4_ = 0;
    QPainter::drawImage((QPointF *)local_b8,(QImage *)local_58);
    QPainter::~QPainter((QPainter *)local_b8);
  }
  QPainter::drawImage((QPointF *)painter,(QImage *)dest);
  QPainter::~QPainter((QPainter *)&local_e0);
  QImage::~QImage((QImage *)&local_98);
  QImage::~QImage((QImage *)&local_78);
  QVar4 = (QRect)local_b8;
LAB_0039de69:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    local_b8 = (undefined1  [16])QVar4;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapColorizeFilter::draw(QPainter *painter, const QPointF &dest, const QPixmap &src, const QRectF &srcRect) const
{
    Q_D(const QPixmapColorizeFilter);

    if (src.isNull())
        return;

    // raster implementation

    if (!d->opaque) {
        painter->drawPixmap(dest, src, srcRect);
        return;
    }

    QImage srcImage;
    QImage destImage;

    if (srcRect.isNull()) {
        srcImage = src.toImage();
        const auto format = srcImage.hasAlphaChannel() ? QImage::Format_ARGB32_Premultiplied : QImage::Format_RGB32;
        srcImage = std::move(srcImage).convertToFormat(format);
        destImage = QImage(srcImage.size(), srcImage.format());
    } else {
        QRect rect = srcRect.toAlignedRect().intersected(src.rect());

        srcImage = src.copy(rect).toImage();
        const auto format = srcImage.hasAlphaChannel() ? QImage::Format_ARGB32_Premultiplied : QImage::Format_RGB32;
        srcImage = std::move(srcImage).convertToFormat(format);
        destImage = QImage(rect.size(), srcImage.format());
    }
    destImage.setDevicePixelRatio(src.devicePixelRatio());

    // do colorizing
    QPainter destPainter(&destImage);
    grayscale(srcImage, destImage, srcImage.rect());
    destPainter.setCompositionMode(QPainter::CompositionMode_Screen);
    destPainter.fillRect(srcImage.rect(), d->color);
    destPainter.end();

    if (d->alphaBlend) {
        // alpha blending srcImage and destImage
        QImage buffer = srcImage;
        QPainter bufPainter(&buffer);
        bufPainter.setOpacity(d->strength);
        bufPainter.drawImage(0, 0, destImage);
        bufPainter.end();
        destImage = std::move(buffer);
    }

    if (srcImage.hasAlphaChannel()) {
        Q_ASSERT(destImage.format() == QImage::Format_ARGB32_Premultiplied);
        QPainter maskPainter(&destImage);
        maskPainter.setCompositionMode(QPainter::CompositionMode_DestinationIn);
        maskPainter.drawImage(0, 0, srcImage);
    }

    painter->drawImage(dest, destImage);
}